

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAligned
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  bool bVar1;
  void *pvVar2;
  SerialArena *arena;
  SerialArena *local_20;
  
  if ((((byte)this[8] & 2) == 0) && (bVar1 = GetSerialArenaFast(this,&local_20), bVar1)) {
    pvVar2 = SerialArena::AllocateAligned
                       (local_20,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
    return pvVar2;
  }
  pvVar2 = AllocateAlignedFallback(this,n,type);
  return pvVar2;
}

Assistant:

void* AllocateAligned(size_t n, const std::type_info* type) {
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                              GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, AllocPolicy());
    } else {
      return AllocateAlignedFallback(n, type);
    }
  }